

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

bool FIX::Message::isTrailerField(int field)

{
  bool bVar1;
  
  bVar1 = true;
  if (((field != 10) && (field != 0x59)) && (field != 0x5d)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Message::isTrailerField( int field )
{
  switch ( field )
  {
    case FIELD::SignatureLength:
    case FIELD::Signature:
    case FIELD::CheckSum:
    return true;
    default:
    return false;
  };
}